

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

REStackFrame * __thiscall
icu_63::RegexMatcher::StateSave
          (RegexMatcher *this,REStackFrame *fp,int64_t savePatIdx,UErrorCode *status)

{
  int iVar1;
  UVector64 *this_00;
  UBool UVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int32_t minimumCapacity;
  REStackFrame *pRVar6;
  
  if (U_ZERO_ERROR < *status) {
    return fp;
  }
  this_00 = this->fStack;
  iVar1 = this->fFrameSize;
  iVar3 = this_00->count;
  minimumCapacity = iVar3 + iVar1;
  if ((minimumCapacity < 0) || (this_00->capacity < minimumCapacity)) {
    UVar2 = UVector64::expandCapacity(this_00,minimumCapacity,status);
    if (UVar2 == '\0') {
      pRVar6 = (REStackFrame *)0x0;
      goto LAB_0023f660;
    }
    iVar3 = this_00->count;
    minimumCapacity = iVar1 + iVar3;
  }
  pRVar6 = (REStackFrame *)(this_00->elements + iVar3);
  this_00->count = minimumCapacity;
LAB_0023f660:
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    lVar4 = (long)this->fFrameSize;
    lVar5 = 0;
    do {
      *(undefined8 *)((long)pRVar6->fExtra + lVar5 + -0x10) =
           *(undefined8 *)((long)pRVar6 + lVar5 + lVar4 * -8);
      lVar5 = lVar5 + 8;
    } while (lVar4 * 8 != lVar5);
    iVar1 = this->fTickCounter;
    this->fTickCounter = iVar1 + -1;
    if (iVar1 < 2) {
      IncrementTime(this,status);
    }
    *(int64_t *)((long)pRVar6 + lVar4 * -8 + 8) = savePatIdx;
    fp = pRVar6;
  }
  else {
    *status = U_REGEX_STACK_OVERFLOW;
  }
  return fp;
}

Assistant:

inline REStackFrame *RegexMatcher::StateSave(REStackFrame *fp, int64_t savePatIdx, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return fp;
    }
    // push storage for a new frame.
    int64_t *newFP = fStack->reserveBlock(fFrameSize, status);
    if (U_FAILURE(status)) {
        // Failure on attempted stack expansion.
        //   Stack function set some other error code, change it to a more
        //   specific one for regular expressions.
        status = U_REGEX_STACK_OVERFLOW;
        // We need to return a writable stack frame, so just return the
        //    previous frame.  The match operation will stop quickly
        //    because of the error status, after which the frame will never
        //    be looked at again.
        return fp;
    }
    fp = (REStackFrame *)(newFP - fFrameSize);  // in case of realloc of stack.

    // New stack frame = copy of old top frame.
    int64_t *source = (int64_t *)fp;
    int64_t *dest   = newFP;
    for (;;) {
        *dest++ = *source++;
        if (source == newFP) {
            break;
        }
    }

    fTickCounter--;
    if (fTickCounter <= 0) {
       IncrementTime(status);    // Re-initializes fTickCounter
    }
    fp->fPatIdx = savePatIdx;
    return (REStackFrame *)newFP;
}